

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_branch_n(DisasContext_conflict8 *dc,target_ulong pc1)

{
  target_ulong tVar1;
  TCGContext_conflict8 *tcg_ctx;
  TCGv_i64 v1;
  TCGv_i64 c2;
  uintptr_t o_1;
  uintptr_t o;
  
  tVar1 = dc->npc;
  if (tVar1 == 1) {
    tcg_ctx = dc->uc->tcg_ctx;
    tcg_gen_mov_i64_sparc64(tcg_ctx,(TCGv_i32)tcg_ctx->cpu_pc,(TCGv_i32)tcg_ctx->cpu_npc);
    tcg_gen_addi_i64_sparc64(tcg_ctx,tcg_ctx->cpu_npc,tcg_ctx->cpu_npc,4);
    v1 = tcg_const_i64_sparc64(tcg_ctx,pc1);
    c2 = tcg_const_i64_sparc64(tcg_ctx,0);
    tcg_gen_movcond_i64_sparc64
              (tcg_ctx,TCG_COND_NE,tcg_ctx->cpu_npc,tcg_ctx->cpu_cond,c2,v1,tcg_ctx->cpu_npc);
    tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)(v1 + (long)tcg_ctx));
    tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
  }
  else {
    dc->jump_pc[0] = pc1;
    dc->jump_pc[1] = tVar1 + 4;
    dc->npc = 2;
  }
  dc->pc = tVar1;
  return;
}

Assistant:

static void gen_branch_n(DisasContext *dc, target_ulong pc1)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    target_ulong npc = dc->npc;

    if (likely(npc != DYNAMIC_PC)) {
        dc->pc = npc;
        dc->jump_pc[0] = pc1;
        dc->jump_pc[1] = npc + 4;
        dc->npc = JUMP_PC;
    } else {
        TCGv t, z;

        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_pc, tcg_ctx->cpu_npc);

        tcg_gen_addi_tl(tcg_ctx, tcg_ctx->cpu_npc, tcg_ctx->cpu_npc, 4);
        t = tcg_const_tl(tcg_ctx, pc1);
        z = tcg_const_tl(tcg_ctx, 0);
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->cpu_npc, tcg_ctx->cpu_cond, z, t, tcg_ctx->cpu_npc);
        tcg_temp_free(tcg_ctx, t);
        tcg_temp_free(tcg_ctx, z);

        dc->pc = DYNAMIC_PC;
    }
}